

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall Assimp::Ogre::OgreBinarySerializer::ReadMesh(OgreBinarySerializer *this,Mesh *mesh)

{
  bool bVar1;
  uint16_t uVar2;
  Logger *pLVar3;
  VertexData *dest;
  char *pcVar4;
  OgreBinarySerializer *this_00;
  ushort uVar5;
  char *local_1c8 [4];
  OgreBinarySerializer local_1a8 [15];
  
  bVar1 = Read<bool>(this);
  mesh->hasSkeletalAnimations = bVar1;
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"Reading Mesh");
  pLVar3 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[26]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [26])"  - Skeletal animations: ");
  pcVar4 = "false";
  if (mesh->hasSkeletalAnimations != false) {
    pcVar4 = "true";
  }
  std::operator<<((ostream *)local_1a8,pcVar4);
  std::__cxx11::stringbuf::str();
  Logger::debug(pLVar3,local_1c8[0]);
  std::__cxx11::string::~string((string *)local_1c8);
  this_00 = local_1a8;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
LAB_0045b8b8:
    NormalizeBoneWeights(this_00,mesh->sharedVertexData);
    return;
  }
  do {
    dest = (VertexData *)0x1;
    this_00 = this;
    uVar2 = ReadHeader(this,true);
    uVar5 = uVar2 << 4 | (uVar2 ^ 0x8000) >> 0xc;
    do {
      if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) goto LAB_0045b8b8;
      if ((0xf < uVar5) || ((0xf07fU >> (uVar5 & 0x1f) & 1) == 0)) {
        RollbackHeader(this);
        this_00 = this;
        goto LAB_0045b8b8;
      }
      switch(uVar2 - 0x4000 >> 0xc) {
      case 0:
        dest = (VertexData *)mesh;
        this_00 = this;
        ReadSubMesh(this,mesh);
        break;
      case 1:
        dest = (VertexData *)operator_new(200);
        VertexData::VertexData(dest);
        mesh->sharedVertexData = dest;
        this_00 = this;
        ReadGeometry(this,dest);
        break;
      case 2:
        dest = (VertexData *)mesh;
        this_00 = this;
        ReadMeshSkeletonLink(this,mesh);
        break;
      case 3:
        dest = mesh->sharedVertexData;
        this_00 = this;
        ReadBoneAssignment(this,dest);
        break;
      case 4:
        dest = (VertexData *)mesh;
        this_00 = this;
        ReadMeshLodInfo(this,mesh);
        break;
      case 5:
        dest = (VertexData *)0x1c;
        this_00 = this;
        SkipBytes(this,0x1c);
        break;
      case 6:
        dest = (VertexData *)mesh;
        this_00 = this;
        ReadSubMeshNames(this,mesh);
        break;
      case 7:
        this_00 = this;
        ReadEdgeList(this,(Mesh *)dest);
        break;
      case 8:
        dest = (VertexData *)mesh;
        this_00 = this;
        ReadPoses(this,mesh);
        break;
      case 9:
        dest = (VertexData *)mesh;
        this_00 = this;
        ReadAnimations(this,mesh);
        break;
      case 10:
        this_00 = this;
        ReadMeshExtremes(this,(Mesh *)dest);
      }
    } while (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current);
  } while( true );
}

Assistant:

void OgreBinarySerializer::ReadMesh(Mesh *mesh)
{
    mesh->hasSkeletalAnimations = Read<bool>();

    ASSIMP_LOG_DEBUG("Reading Mesh");
    ASSIMP_LOG_DEBUG_F( "  - Skeletal animations: ", mesh->hasSkeletalAnimations ? "true" : "false" );

    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_GEOMETRY ||
             id == M_SUBMESH ||
             id == M_MESH_SKELETON_LINK ||
             id == M_MESH_BONE_ASSIGNMENT ||
             id == M_MESH_LOD ||
             id == M_MESH_BOUNDS ||
             id == M_SUBMESH_NAME_TABLE ||
             id == M_EDGE_LISTS ||
             id == M_POSES ||
             id == M_ANIMATIONS ||
             id == M_TABLE_EXTREMES))
        {
            switch(id)
            {
                case M_GEOMETRY:
                {
                    mesh->sharedVertexData = new VertexData();
                    ReadGeometry(mesh->sharedVertexData);
                    break;
                }
                case M_SUBMESH:
                {
                    ReadSubMesh(mesh);
                    break;
                }
                case M_MESH_SKELETON_LINK:
                {
                    ReadMeshSkeletonLink(mesh);
                    break;
                }
                case M_MESH_BONE_ASSIGNMENT:
                {
                    ReadBoneAssignment(mesh->sharedVertexData);
                    break;
                }
                case M_MESH_LOD:
                {
                    ReadMeshLodInfo(mesh);
                    break;
                }
                case M_MESH_BOUNDS:
                {
                    ReadMeshBounds(mesh);
                    break;
                }
                case M_SUBMESH_NAME_TABLE:
                {
                    ReadSubMeshNames(mesh);
                    break;
                }
                case M_EDGE_LISTS:
                {
                    ReadEdgeList(mesh);
                    break;
                }
                case M_POSES:
                {
                    ReadPoses(mesh);
                    break;
                }
                case M_ANIMATIONS:
                {
                    ReadAnimations(mesh);
                    break;
                }
                case M_TABLE_EXTREMES:
                {
                    ReadMeshExtremes(mesh);
                    break;
                }
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }

    NormalizeBoneWeights(mesh->sharedVertexData);
}